

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O2

void __thiscall
GrcManager::OutputSileTable
          (GrcManager *this,GrcBinaryStream *pbstrm,utf16 *pchSrcFontFamily,char *pchSrcFileName,
          uint luMasterChecksum,uint *pnCreateTime,uint *pnModifyTime,int *pibOffset,int *pcbSize)

{
  undefined1 *os;
  int iVar1;
  uint32_t x;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  offset_t ibOffset;
  
  os = &(pbstrm->super_fstream).field_0x10;
  iVar1 = std::ostream::tellp();
  *pibOffset = iVar1;
  x = VersionForTable(this,0x16);
  GrcBinaryStream::write_32bits_be((ostream *)os,x);
  GrcBinaryStream::write_32bits_be((ostream *)os,luMasterChecksum);
  GrcBinaryStream::write_32bits_be((ostream *)os,*pnCreateTime);
  GrcBinaryStream::write_32bits_be((ostream *)os,pnCreateTime[1]);
  GrcBinaryStream::write_32bits_be((ostream *)os,*pnModifyTime);
  GrcBinaryStream::write_32bits_be((ostream *)os,pnModifyTime[1]);
  sVar3 = gr::utf16len(pchSrcFontFamily);
  GrcBinaryStream::write_16bits_be((ostream *)os,(uint16_t)sVar3);
  for (uVar2 = 0; uVar2 < sVar3; uVar2 = uVar2 + 1) {
    GrcBinaryStream::write_16bits_be((ostream *)os,pchSrcFontFamily[uVar2]);
  }
  GrcBinaryStream::write_8bits_be((ostream *)os,'\0');
  sVar4 = strlen(pchSrcFileName);
  GrcBinaryStream::write_16bits_be((ostream *)os,(uint16_t)sVar4);
  std::ostream::write(os,(long)pchSrcFileName);
  GrcBinaryStream::write_8bits_be((ostream *)os,'\0');
  ibOffset = std::ostream::tellp();
  *pcbSize = (int)ibOffset - *pibOffset;
  GrcBinaryStream::SeekPadLong(pbstrm,ibOffset);
  return;
}

Assistant:

void GrcManager::OutputSileTable(GrcBinaryStream * pbstrm,
	 utf16 * pchSrcFontFamily, char * pchSrcFileName, unsigned int luMasterChecksum,
	 unsigned int * pnCreateTime, unsigned int * pnModifyTime,
	 int * pibOffset, int * pcbSize)
{
	*pibOffset = int(pbstrm->Position());

	// version
	int fxd = VersionForTable(ktiSile);
	pbstrm->WriteInt(fxd);

	// master check sum from source font
	pbstrm->WriteInt(luMasterChecksum);

	// create and modify times of source font
	pbstrm->WriteInt(pnCreateTime[0]);
	pbstrm->WriteInt(pnCreateTime[1]);
	pbstrm->WriteInt(pnModifyTime[0]);
	pbstrm->WriteInt(pnModifyTime[1]);

	// source font family name
	auto cchFontFamily = utf16len(pchSrcFontFamily);
	pbstrm->WriteShort(cchFontFamily);
	for (auto ich = 0U; ich < cchFontFamily; ++ich)
		pbstrm->WriteShort(pchSrcFontFamily[ich]);
	pbstrm->WriteByte(0);

	// source font file
	auto cchFile = strlen(pchSrcFileName);
	pbstrm->WriteShort(cchFile);
	pbstrm->Write(pchSrcFileName, cchFile);
	pbstrm->WriteByte(0);

	// handle size and padding
	auto lPos = pbstrm->Position();
	*pcbSize = int(lPos - *pibOffset);
	pbstrm->SeekPadLong(lPos);
}